

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
* __thiscall
TaprootBuilder::GetTreeTuples
          (vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *__return_storage_ptr__,TaprootBuilder *this)

{
  pointer poVar1;
  pointer pLVar2;
  ulong uVar3;
  long lVar4;
  pointer __args_2;
  long in_FS_OFFSET;
  uint8_t leaf_ver;
  uint8_t depth;
  uchar local_32;
  uchar local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_valid == true) {
    poVar1 = (this->m_branch).
             super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->m_branch).
                  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)poVar1 >> 6;
    if ((lVar4 == 0) ||
       ((lVar4 == 1 &&
        (*(bool *)((long)&(poVar1->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false> +
                  0x38) != false)))) {
      (__return_storage_ptr__->
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      poVar1 = (this->m_branch).
               super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_branch).
          super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != poVar1) {
        __args_2 = *(pointer *)
                    &(poVar1->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                     _M_payload.
                     super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
                     super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload._M_value.
                     leaves.
                     super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
                     ._M_impl;
        pLVar2 = *(pointer *)
                  ((long)&(poVar1->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                          _M_payload.
                          super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
                          super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload._M_value
                          .leaves.
                          super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
                  + 8);
        if (__args_2 != pLVar2) {
          do {
            uVar3 = (long)*(pointer *)
                           ((long)&(__args_2->merkle_branch).
                                   super__Vector_base<uint256,_std::allocator<uint256>_> + 8) -
                    *(long *)&(__args_2->merkle_branch).
                              super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl >> 5;
            if (0x80 < uVar3) {
              __assert_fail("leaf.merkle_branch.size() <= TAPROOT_CONTROL_MAX_NODE_COUNT",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/signingprovider.cpp"
                            ,0x23b,
                            "std::vector<std::tuple<uint8_t, uint8_t, std::vector<unsigned char>>> TaprootBuilder::GetTreeTuples() const"
                           );
            }
            local_31 = (uchar)uVar3;
            local_32 = (uchar)__args_2->leaf_version;
            std::
            vector<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::
            emplace_back<unsigned_char&,unsigned_char&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                      ((vector<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                        *)__return_storage_ptr__,&local_31,&local_32,&__args_2->script);
            __args_2 = __args_2 + 1;
          } while (__args_2 != pLVar2);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
  }
  __assert_fail("IsComplete()",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/signingprovider.cpp"
                ,0x236,
                "std::vector<std::tuple<uint8_t, uint8_t, std::vector<unsigned char>>> TaprootBuilder::GetTreeTuples() const"
               );
}

Assistant:

std::vector<std::tuple<uint8_t, uint8_t, std::vector<unsigned char>>> TaprootBuilder::GetTreeTuples() const
{
    assert(IsComplete());
    std::vector<std::tuple<uint8_t, uint8_t, std::vector<unsigned char>>> tuples;
    if (m_branch.size()) {
        const auto& leaves = m_branch[0]->leaves;
        for (const auto& leaf : leaves) {
            assert(leaf.merkle_branch.size() <= TAPROOT_CONTROL_MAX_NODE_COUNT);
            uint8_t depth = (uint8_t)leaf.merkle_branch.size();
            uint8_t leaf_ver = (uint8_t)leaf.leaf_version;
            tuples.emplace_back(depth, leaf_ver, leaf.script);
        }
    }
    return tuples;
}